

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

string * __thiscall
spirv_cross::
join<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
          (string *__return_storage_ptr__,spirv_cross *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts,char (*ts_1) [2],
          char **ts_2,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,
          char (*ts_4) [2],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,
          int *ts_6,char (*ts_7) [2])

{
  undefined1 local_1130 [8];
  StringStream<4096UL,_4096UL> stream;
  char (*ts_local_4) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local_3;
  char **ts_local_2;
  char (*ts_local_1) [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_local;
  
  stream.saved_buffers.stack_storage.aligned_char._184_8_ = ts_3;
  StringStream<4096UL,_4096UL>::StringStream((StringStream<4096UL,_4096UL> *)local_1130);
  inner::
  join_helper<std::__cxx11::string&,char_const(&)[2],char_const*&,std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,int_const&,char_const(&)[2]>
            ((StringStream<4096UL,_4096UL> *)local_1130,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char (*) [2])ts,(char **)ts_1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,
             (char (*) [2])stream.saved_buffers.stack_storage.aligned_char._184_8_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,(int *)ts_5,
             (char (*) [2])ts_6);
  StringStream<4096ul,4096ul>::str_abi_cxx11_
            (__return_storage_ptr__,(StringStream<4096ul,4096ul> *)local_1130);
  StringStream<4096UL,_4096UL>::~StringStream((StringStream<4096UL,_4096UL> *)local_1130);
  return __return_storage_ptr__;
}

Assistant:

std::string join(Ts &&... ts)
{
	StringStream<> stream;
	inner::join_helper(stream, std::forward<Ts>(ts)...);
	return stream.str();
}